

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_loop(int argc,long argv,int unpack)

{
  int iVar1;
  int iVar2;
  __sighandler_t p_Var3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 *puVar12;
  char *pcVar13;
  undefined8 *puVar14;
  ulong uVar15;
  byte bVar16;
  int in_stack_00000068;
  int iStack0000000000000070;
  int iStack0000000000000074;
  int in_stack_00000078;
  int in_stack_00000080;
  undefined8 in_stack_00000088;
  int in_stack_00000090;
  char in_stack_0000049c;
  int in_stack_000006a0;
  int in_stack_000006a4;
  int in_stack_000006a8;
  undefined8 auStack_dc8 [214];
  int local_718;
  int status;
  int islossless;
  int local_70c;
  char *local_708;
  size_t local_700;
  undefined8 local_6f8;
  char *local_6f0;
  long local_6e8;
  long local_6e0;
  char answer [30];
  char outfits [513];
  char temp [513];
  char infits [513];
  char valchar [78];
  
  bVar16 = 0;
  pcVar6 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz.#()+,-_@[]/^{}";
  pcVar13 = valchar;
  for (lVar8 = 0x4e; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pcVar13 = *pcVar6;
    pcVar6 = pcVar6 + 1;
    pcVar13 = pcVar13 + 1;
  }
  status = 0;
  local_70c = unpack;
  local_6e8 = argv;
  if (in_stack_000006a4 == 0x2a) {
    if (in_stack_000006a8 != 0) {
      local_708 = &stack0x0000049c;
      if ((in_stack_00000088._4_4_ != 0) && (in_stack_0000049c != '\0')) {
        outreport = (FILE *)fopen64(local_708,"w");
        fwrite(" Filename Extension BITPIX NAXIS1 NAXIS2 Size N_nulls Minval Maxval Mean Sigm Noise1 Noise2 Noise3 Noise5 T_whole T_rowbyrow "
               ,0x7d,1,(FILE *)outreport);
        fwrite("[Comp_ratio, Pack_cpu, Unpack_cpu, Lossless readtimes] (repeated for Rice, Hcompress, and GZIP)\n"
               ,0x60,1,(FILE *)outreport);
      }
      tempfilename[0] = '\0';
      tempfilename2[0] = '\0';
      tempfilename3[0] = '\0';
      p_Var3 = signal(2,(__sighandler_t)0x1);
      if (p_Var3 != (__sighandler_t)0x1) {
        signal(2,abort_fpack);
      }
      p_Var3 = signal(0xf,(__sighandler_t)0x1);
      if (p_Var3 != (__sighandler_t)0x1) {
        signal(0xf,abort_fpack);
      }
      p_Var3 = signal(1,(__sighandler_t)0x1);
      if (p_Var3 != (__sighandler_t)0x1) {
        signal(1,abort_fpack);
      }
      lVar8 = (long)in_stack_000006a0;
      local_6f0 = &stack0x00000094;
      local_6e0 = (long)argc;
      local_6f8 = 0xfffffffd;
      local_718 = 0;
      do {
        if (local_6e0 <= lVar8) {
          if ((in_stack_00000088._4_4_ != 0) && (in_stack_0000049c != '\0')) {
            fclose((FILE *)outreport);
          }
          return 0;
        }
        temp._0_8_ = temp._0_8_ & 0xffffffffffffff00;
        outfits[0] = '\0';
        islossless = 1;
        strncpy(infits,*(char **)(local_6e8 + lVar8 * 8),0x200);
        infits[0x200] = '\0';
        if (local_70c == 0) {
          if (in_stack_00000068 != 0) goto LAB_00107a82;
          iVar1 = 0;
          if (in_stack_00000088._4_4_ == 0) {
            if (*local_708 == '\0') {
              if (infits[0] == '-') {
                builtin_strncpy(outfits,"input.fits",0xb);
              }
              else {
                strcpy(outfits,infits);
              }
              sVar4 = strlen(outfits);
              if (2 < (int)(uint)sVar4) {
                uVar11 = (ulong)((uint)sVar4 & 0x7fffffff);
                local_700 = sVar4;
                iVar1 = strcmp(".gz",answer + uVar11 + 0x1d);
                iVar7 = (int)local_6f8;
                iVar2 = (int)local_700;
                if (iVar1 == 0) {
LAB_0010804b:
                  outfits[(uint)(iVar2 + iVar7)] = '\0';
                }
                else if (iVar2 != 3) {
                  iVar1 = strcmp(".bz2",answer + uVar11 + 0x1c);
                  iVar7 = -4;
                  iVar2 = (int)local_700;
                  if (iVar1 == 0) goto LAB_0010804b;
                }
              }
              sVar4 = strlen(outfits);
              uVar10 = (uint)sVar4;
              if ((3 < (int)uVar10) &&
                 (iVar1 = strcmp(".imh",answer + (ulong)(uVar10 & 0x7fffffff) + 0x1c), iVar1 == 0))
              {
                outfits[uVar10 - 4] = '\0';
                sVar4 = strlen(outfits);
                sVar5 = strlen(outfits);
                if (sVar4 == 0x1fc) {
                  outfits[sVar5 + 4] = '\0';
                }
                else {
                  (outfits + sVar5 + 4)[0] = 's';
                  (outfits + sVar5 + 4)[1] = '\0';
                }
                builtin_strncpy(outfits + sVar5,".fit",4);
                local_718 = 1;
              }
              if (iStack0000000000000070 == 0) {
                sVar4 = strlen(outfits);
                builtin_strncpy(outfits + sVar4,".fz",4);
              }
              goto LAB_00108235;
            }
            strcpy(outfits,local_708);
          }
        }
        else {
          if ((infits[0] != '-') && (iVar1 = fp_access(infits), iVar1 != 0)) {
            sVar4 = strlen(infits);
            builtin_strncpy(infits + sVar4,".fz",4);
          }
          if (in_stack_00000068 == 0) {
            if (*local_708 != '\0') {
              strcpy(outfits,local_708);
              iVar1 = 0;
              goto LAB_00107a94;
            }
            if (*local_6f0 != '\0') {
              strcpy(outfits,local_6f0);
            }
            if (infits[0] == '-') {
              builtin_strncpy(outfits,"output.fits",0xc);
            }
            else {
              strcat(outfits,infits);
            }
            sVar4 = strlen(outfits);
            uVar10 = (uint)sVar4;
            if (2 < (int)uVar10) {
              iVar1 = strcmp(".gz",answer + (ulong)(uVar10 & 0x7fffffff) + 0x1d);
              if (iVar1 == 0) {
                iVar1 = -3;
LAB_00107f52:
                outfits[uVar10 + iVar1] = '\0';
              }
              else if (uVar10 != 3) {
                iVar2 = strcmp(".bz2",answer + (ulong)(uVar10 & 0x7fffffff) + 0x1c);
                iVar1 = -4;
                if (iVar2 == 0) goto LAB_00107f52;
              }
            }
            sVar4 = strlen(outfits);
            uVar10 = (uint)sVar4;
            if ((2 < (int)uVar10) &&
               (iVar1 = strcmp(".fz",answer + (ulong)(uVar10 & 0x7fffffff) + 0x1d), iVar1 == 0)) {
              outfits[uVar10 - 3] = '\0';
            }
LAB_00108235:
            iVar1 = 0;
          }
          else {
LAB_00107a82:
            outfits[0] = '-';
            outfits[1] = '\0';
            iVar1 = in_stack_00000068;
          }
        }
LAB_00107a94:
        strncpy(temp,outfits,0x200);
        temp[0x200] = '\0';
        if (infits[0] != '-') {
          iVar2 = strcmp(infits,outfits);
          if (iVar2 == 0) {
            if (iStack0000000000000070 == 0) {
              pcVar6 = "\nError: must use -F flag to clobber input file.\n";
              goto LAB_0010827c;
            }
            fp_tmpnam("Tmp1",infits,outfits);
            strcpy(tempfilename,outfits);
            iVar1 = in_stack_00000068;
          }
        }
        if ((in_stack_00000090 != 0) && (iVar1 == 0)) {
          printf("%s ",infits);
        }
        if (in_stack_00000088._4_4_ == 0) {
          if (local_70c != 0) {
            if (in_stack_00000068 != 0) {
              puVar12 = (undefined8 *)&stack0x00000008;
              puVar14 = auStack_dc8;
              for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar14 = *puVar12;
                puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
                puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
              }
              fp_unpack(infits,outfits);
              goto LAB_00107ce6;
            }
            fp_tmpnam("Tmp2",outfits,tempfilename2);
            puVar12 = (undefined8 *)&stack0x00000008;
            puVar14 = auStack_dc8;
            for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar14 = *puVar12;
              puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
            }
            fp_unpack(infits,tempfilename2);
            iVar1 = rename(tempfilename2,outfits);
            if (iVar1 == 0) {
              tempfilename2[0] = '\0';
              goto LAB_00107ce6;
            }
            fp_msg("Failed to rename temporary file name:\n  ");
            fp_msg(tempfilename2);
            fp_msg(" -> ");
            pcVar6 = outfits;
LAB_001082f3:
            fp_msg(pcVar6);
            pcVar6 = "\n";
            goto LAB_0010827c;
          }
          puVar12 = (undefined8 *)&stack0x00000008;
          puVar14 = auStack_dc8;
          for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar14 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
            puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
          }
          fp_pack(infits,outfits,&islossless);
LAB_00107ce6:
          if (in_stack_00000068 == 0) {
            iVar1 = strcmp(infits,temp);
            if (iStack0000000000000070 == 0 || iVar1 != 0) {
              if (iStack0000000000000070 != 0 || iStack0000000000000074 != 0) {
                if (in_stack_00000078 == 0 && islossless == 0) {
                  fp_msg("\nFile ");
                  fp_msg(infits);
                  fp_msg("\nwas compressed with a LOSSY method.  \n");
                  fp_msg("Delete the original file? (Y/N) ");
                  fgets(answer,0x1d,_stdin);
                  if ((answer[0] & 0xdfU) != 0x59) {
                    fp_msg("\noriginal file NOT deleted!\n");
                    goto LAB_001080fb;
                  }
                }
                if (local_718 == 0) {
                  iVar1 = remove(infits);
                  if (iVar1 != 0) {
                    pcVar6 = "\nError deleting input file ";
                    goto LAB_001082e6;
                  }
                }
                else {
                  iVar1 = fits_delete_iraf_file(infits,&status);
                  if (iVar1 != 0) goto LAB_001082df;
                }
              }
            }
            else {
              if (in_stack_00000078 == 0 && islossless == 0) {
                fp_msg("\nFile ");
                fp_msg(infits);
                fp_msg("\nwas compressed with a LOSSY method.  Overwrite the\n");
                fp_msg("original file with the compressed version? (Y/N) ");
                fgets(answer,0x1d,_stdin);
                if ((answer[0] & 0xdfU) != 0x59) {
                  fp_msg("\noriginal file NOT overwritten!\n");
                  remove(outfits);
                  goto LAB_001081f0;
                }
              }
              if ((local_718 != 0) && (iVar1 = fits_delete_iraf_file(infits,&status), iVar1 != 0)) {
LAB_001082df:
                pcVar6 = "\nError deleting IRAF .imh and .pix files.\n";
LAB_001082e6:
                fp_msg(pcVar6);
                pcVar6 = infits;
                goto LAB_001082f3;
              }
              iVar1 = rename(outfits,temp);
              if (iVar1 != 0) {
                fp_msg("\nError renaming tmp file to ");
                pcVar6 = temp;
                goto LAB_001082f3;
              }
              tempfilename[0] = '\0';
              strcpy(outfits,temp);
            }
LAB_001080fb:
            if (in_stack_00000080 != 0) {
              builtin_strncpy(temp,"gzip -1 ",9);
              sVar4 = strlen(outfits);
              if (0x1f8 < (int)sVar4) {
                pcVar6 = "\nError: Output file name is too long.\n";
                goto LAB_0010827c;
              }
              uVar11 = sVar4 & 0xffffffff;
              if ((int)sVar4 < 1) {
                uVar11 = 0;
              }
              uVar15 = 0;
              while (uVar11 != uVar15) {
                pcVar6 = strchr(valchar,(int)outfits[uVar15]);
                uVar15 = uVar15 + 1;
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = "\n Error: Invalid characters in output file name.\n";
                  goto LAB_0010827c;
                }
              }
              strcat(temp,outfits);
              system(temp);
              sVar4 = strlen(outfits);
              builtin_strncpy(outfits + sVar4,".gz",4);
            }
            local_718 = 0;
            if ((in_stack_00000090 != 0) && (in_stack_00000068 == 0)) {
              local_718 = 0;
              printf("-> %s\n",outfits);
            }
          }
        }
        else {
          fp_tmpnam("Tmpfile1","",tempfilename);
          fp_tmpnam("Tmpfile2","",tempfilename2);
          puVar12 = (undefined8 *)&stack0x00000008;
          puVar14 = auStack_dc8;
          for (lVar9 = 0xd5; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar14 = *puVar12;
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
            puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
          }
          fp_test(infits,tempfilename,tempfilename2);
          remove(tempfilename);
          tempfilename[0] = '\0';
          remove(tempfilename2);
          tempfilename2[0] = '\0';
        }
LAB_001081f0:
        lVar8 = lVar8 + 1;
      } while( true );
    }
    pcVar6 = "Error: internal preflight error\n";
  }
  else {
    pcVar6 = "Error: internal initialization error\n";
  }
LAB_0010827c:
  fp_msg(pcVar6);
  exit(-1);
}

Assistant:

int fp_loop (int argc, char *argv[], int unpack, fpstate fpvar)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	char	temp[SZ_STR], answer[30];
        char    valchar[]="0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz.#()+,-_@[]/^{}";
	int	ichar=0, outlen=0, iarg, islossless, namelen, iraf_infile = 0, status = 0, ifail;
        
	if (fpvar.initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	} else if (! fpvar.preflight_checked) {
	    fp_msg ("Error: internal preflight error\n"); exit (-1);
	}

	if (fpvar.test_all && fpvar.outfile[0]) {
	    outreport = fopen(fpvar.outfile, "w");
		fprintf(outreport," Filename Extension BITPIX NAXIS1 NAXIS2 Size N_nulls Minval Maxval Mean Sigm Noise1 Noise2 Noise3 Noise5 T_whole T_rowbyrow ");
		fprintf(outreport,"[Comp_ratio, Pack_cpu, Unpack_cpu, Lossless readtimes] (repeated for Rice, Hcompress, and GZIP)\n");
	}


	tempfilename[0] = '\0';
	tempfilename2[0] = '\0';
	tempfilename3[0] = '\0';

/* set up signal handler to delete temporary file on abort */	    
#ifdef SIGINT
    if (signal(SIGINT, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGINT,  abort_fpack); 
    }
#endif

#ifdef SIGTERM
    if (signal(SIGTERM, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGTERM,  abort_fpack); 
    }
#endif

#ifdef SIGHUP
    if (signal(SIGHUP, SIG_IGN) != SIG_IGN) {
	(void) signal(SIGHUP,  abort_fpack);
    }
#endif

	for (iarg=fpvar.firstfile; iarg < argc; iarg++) {

          temp[0] = '\0';
	  outfits[0] = '\0';
          islossless = 1;

	  strncpy (infits, argv[iarg], SZ_STR - 1);
          infits[SZ_STR-1]=0;

          if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* find input file */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then */
		    strcat(infits, ".fz");       /* a .fz version must exsit */
                    /* fp_preflight already checked for enough size to add '.fz' */
	         }
	      }

	      if (fpvar.to_stdout) {
		strcpy(outfits, "-");

              } else if (fpvar.outfile[0]) {  /* user specified output file name */
	          strcpy(outfits, fpvar.outfile);

	      } else {
	          /* construct output file name */
	          if (fpvar.prefix[0]) {
                      /* fp_preflight already checked this */
	              strcpy(outfits,fpvar.prefix);
	          }

	          /* construct output file name */
	          if (infits[0] == '-') {
	            strcpy(outfits, "output.fits");
	          } else {
	            strcat(outfits, infits);
	          }

	          /* remove .gz suffix, if present (output is not gzipped) */
                  namelen = strlen(outfits);
	          if (namelen >= 3 &&  !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	          }
                  else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                            outfits[namelen - 4] = '\0';
                  }

	          /* check for .fz suffix that is sometimes required */
	          /* and remove it if present */
                  namelen = strlen(outfits);
	          if (namelen >= 3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	          }
	      }

	  } else {
	  	/* ********** This section applies to fpack ************ */

	      if (fpvar.to_stdout) {
		strcpy(outfits, "-");
	      } else if (! fpvar.test_all) {

                  if (fpvar.outfile[0]) { /* user specified output file name */
                     strcpy(outfits, fpvar.outfile);
                  }
                  else {
	             /* construct output file name */
	             if (infits[0] == '-') {
	               strcpy(outfits, "input.fits");
	             } else {
	               strcpy(outfits, infits);
	             }
	             /* Remove .gz suffix, if present (output is not gzipped). 
                        Do the same for .bz2 */
                     namelen = strlen(outfits);
	             if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                           outfits[namelen - 3] = '\0';
	             }
                     else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                           outfits[namelen - 4] = '\0';
                     }

	             /* remove .imh suffix (IRAF format image), and replace with .fits */
                     namelen = strlen(outfits);
	             if (namelen >= 4 && !strcmp(".imh", outfits + namelen - 4) ) {
                           outfits[namelen - 4] = '\0';
                           if (strlen(outfits) == SZ_STR-5)
                              strcat(outfits, ".fit");
                           else
                              strcat(outfits, ".fits");
                           iraf_infile = 1;  /* this is an IRAF format input file */
			              /* change the output name to "NAME.fits.fz" */
	             }

	             /* If not clobbering the input file, add .fz suffix to output name */
	             if (! fpvar.clobber)
		           strcat(outfits, ".fz");
	          }
	      }
	  }

          strncpy(temp, outfits, SZ_STR-1);
          temp[SZ_STR-1]=0;

	  if (infits[0] != '-') {  /* if not reading from stdin stream */
             if (!strcmp(infits, outfits) ) {  /* are input and output names the same? */

                /* clobber the input file with the output file with the same name */
                if (! fpvar.clobber) {
                    fp_msg ("\nError: must use -F flag to clobber input file.\n");
		    exit (-1);
		} 

                /* create temporary file name in the output directory (same as input directory)*/
		fp_tmpnam("Tmp1", infits, outfits);
		
                strcpy(tempfilename, outfits);  /* store temp file name, in case of abort */
	      }
	    }


            /* *************** now do the real work ********************* */
	    
	    if (fpvar.verbose && ! fpvar.to_stdout)
		printf("%s ", infits);
		
	    if (fpvar.test_all) {   /* compare all the algorithms */

                /* create 2 temporary file names, in the CWD */
		fp_tmpnam("Tmpfile1", "", tempfilename);
		fp_tmpnam("Tmpfile2", "", tempfilename2);

		fp_test (infits, tempfilename, tempfilename2, fpvar);

		remove(tempfilename);
                tempfilename[0] = '\0';   /* clear the temp file name */
		remove(tempfilename2);
                tempfilename2[0] = '\0';
                continue;

	    } else if (unpack) {
		if (fpvar.to_stdout) {
			/* unpack the input file to the stdout stream */
			fp_unpack (infits, outfits, fpvar);
		} else {
			/* unpack to temporary file, so other tasks can't open it until it is renamed */

			/* create  temporary file name, in the output directory */
			fp_tmpnam("Tmp2", outfits, tempfilename2);

			/* unpack the input file to the temporary file */
			fp_unpack (infits, tempfilename2, fpvar);

			/* rename the temporary file to it's real name */
			ifail = rename(tempfilename2, outfits);
			if (ifail) {
			    fp_msg("Failed to rename temporary file name:\n  ");
			    fp_msg(tempfilename2);
			    fp_msg(" -> ");
			    fp_msg(outfits);
			    fp_msg("\n");
			    exit (-1);
			} else {
			    tempfilename2[0] = '\0';  /* clear temporary file name */
			}
		}
	    }  else {
		fp_pack (infits, outfits, fpvar, &islossless);
	    }

	    if (fpvar.to_stdout) {
		continue;
	    }

            /* ********** clobber and/or delete files, if needed ************** */

            if (!strcmp(infits, temp) && fpvar.clobber ) {  

		if (!islossless && ! fpvar.do_not_prompt) {
		    fp_msg ("\nFile ");
		    fp_msg (infits); 
		    fp_msg ("\nwas compressed with a LOSSY method.  Overwrite the\n");
		    fp_msg ("original file with the compressed version? (Y/N) ");
		    fgets(answer, 29, stdin);
		    if (answer[0] != 'Y' && answer[0] != 'y') {
		        fp_msg ("\noriginal file NOT overwritten!\n");
			remove(outfits);
                        continue;
		    }
		}

		if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   if (fits_delete_iraf_file(infits, &status)) {
		        fp_msg("\nError deleting IRAF .imh and .pix files.\n");
			fp_msg(infits); fp_msg ("\n"); exit (-1);
		    }
		}
				
#if defined(unix) || defined(__unix__)  || defined(__unix)
	        /* rename clobbers input on Unix platforms */
		if (rename (outfits, temp) != 0) {
		        fp_msg ("\nError renaming tmp file to ");
		        fp_msg (temp); fp_msg ("\n"); exit (-1);
		}
#else
	        /* rename DOES NOT clobber existing files on Windows platforms */
                /* so explicitly remove any existing file before renaming the file */
                remove(temp);
		if (rename (outfits, temp) != 0) {
		        fp_msg ("\nError renaming tmp file to ");
		        fp_msg (temp); fp_msg ("\n"); exit (-1);
		}
#endif

		tempfilename[0] = '\0';  /* clear temporary file name */
                strcpy(outfits, temp);

	    } else if (fpvar.clobber || fpvar.delete_input) {      /* delete the input file */
	         if (!islossless && !fpvar.do_not_prompt) {  /* user did not turn off delete prompt */
		    fp_msg ("\nFile ");
		    fp_msg (infits); 
		    fp_msg ("\nwas compressed with a LOSSY method.  \n");
		    fp_msg ("Delete the original file? (Y/N) ");
		    fgets(answer, 29, stdin);
		    if (answer[0] != 'Y' && answer[0] != 'y') {  /* user abort */
		        fp_msg ("\noriginal file NOT deleted!\n");
		    } else {
			if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   	    if (fits_delete_iraf_file(infits, &status)) {
		        	fp_msg("\nError deleting IRAF .imh and .pix files.\n");
				fp_msg(infits); fp_msg ("\n"); exit (-1);
			    }
		        }  else if (remove(infits) != 0) {  /* normal case of deleting input FITS file */
		            fp_msg ("\nError deleting input file ");
		            fp_msg (infits); fp_msg ("\n"); exit (-1);
		        }
		    }
		  } else {   /* user said don't prompt, so just delete the input file */
			if (iraf_infile) {  /* special case of deleting an IRAF format header and pixel file */
		   	    if (fits_delete_iraf_file(infits, &status)) {
		        	fp_msg("\nError deleting IRAF .imh and .pix files.\n");
				fp_msg(infits); fp_msg ("\n"); exit (-1);
			    }
		        }  else if (remove(infits) != 0) {  /* normal case of deleting input FITS file */
		            fp_msg ("\nError deleting input file ");
		            fp_msg (infits); fp_msg ("\n"); exit (-1);
		        }
		  }
	    }
            iraf_infile = 0; 

	    if (fpvar.do_gzip_file) {       /* gzip the output file */
		strcpy(temp, "gzip -1 ");
                outlen = strlen(outfits);
                if (outlen + 8 > SZ_STR-1)
                {
                   fp_msg("\nError: Output file name is too long.\n");
                   exit(-1);
                }
                for (ichar=0; ichar < outlen; ++ichar)
                {
                   if (!strchr(valchar, outfits[ichar]))
                   {
                      fp_msg("\n Error: Invalid characters in output file name.\n");
                      exit(-1);
                   }
                }                
		strcat(temp,outfits);
                system(temp);
	        strcat(outfits, ".gz");    /* only possibible with funpack */
	    }

	    if (fpvar.verbose && ! fpvar.to_stdout)
		printf("-> %s\n", outfits);

	}

	if (fpvar.test_all && fpvar.outfile[0])
	    fclose(outreport);
	return(0);
}